

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> * __thiscall
testing::internal::
TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Times
          (TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)>
           *this,int n)

{
  testing local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  Exactly(local_20,n);
  ExpectationBase::UntypedTimes(&this->super_ExpectationBase,(Cardinality *)local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return this;
}

Assistant:

TypedExpectation& Times(int n) {
    return Times(Exactly(n));
  }